

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_add_text
               (nk_draw_list *list,nk_user_font *font,nk_rect rect,char *text,int len,
               float font_height,nk_color fg)

{
  float fVar1;
  float fVar2;
  float fVar3;
  nk_user_font *list_00;
  float x_00;
  float y;
  nk_vec2 a;
  nk_vec2 c;
  int local_c4;
  float char_width;
  float gw;
  float gh;
  float gy;
  float gx;
  nk_user_font_glyph g;
  int next_glyph_len;
  int glyph_len;
  nk_rune next;
  nk_rune unicode;
  int text_len;
  float x;
  float font_height_local;
  int len_local;
  char *text_local;
  nk_user_font *font_local;
  nk_draw_list *list_local;
  float fStack_18;
  nk_color fg_local;
  nk_rect rect_local;
  
  unicode = 0;
  next = 0;
  glyph_len = 0;
  next_glyph_len = 0;
  g.xadvance = 0.0;
  g.height = 0.0;
  text_len = (int)font_height;
  x = (float)len;
  _font_height_local = text;
  text_local = (char *)font;
  font_local = (nk_user_font *)list;
  list_local._4_4_ = fg;
  _fStack_18 = rect._0_8_;
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x2818,
                  "void nk_draw_list_add_text(struct nk_draw_list *, const struct nk_user_font *, struct nk_rect, const char *, int, float, struct nk_color)"
                 );
  }
  if (((list != (nk_draw_list *)0x0) && (len != 0)) && (text != (char *)0x0)) {
    fStack_18 = rect.x;
    rect_local.x = rect.w;
    if (((list->clip_rect).x <= fStack_18 + rect_local.x) &&
       (fStack_18 <= (list->clip_rect).x + (list->clip_rect).w)) {
      fg_local = (nk_color)rect.y;
      rect_local.y = rect.h;
      if (((list->clip_rect).y <= (float)fg_local + rect_local.y) &&
         ((float)fg_local <= (list->clip_rect).y + (list->clip_rect).h)) {
        nk_draw_list_push_image(list,font->texture);
        unicode = (nk_rune)fStack_18;
        g.xadvance = (float)nk_utf_decode(_font_height_local,(nk_rune *)&glyph_len,(int)x);
        if (g.xadvance != 0.0) {
          list_local._4_4_ =
               (nk_color)
               CONCAT13((nk_byte)(int)((float)((uint)list_local._4_4_ >> 0x18) *
                                      *(float *)&font_local[2].texture),list_local._4_3_);
          while (((int)next < (int)x && g.xadvance != 0.0 && (glyph_len != 0xfffd))) {
            g.height = (float)nk_utf_decode(_font_height_local +
                                            (long)(int)g.xadvance + (long)(int)next,
                                            (nk_rune *)&next_glyph_len,(int)x - next);
            if (next_glyph_len == 0xfffd) {
              local_c4 = 0;
            }
            else {
              local_c4 = next_glyph_len;
            }
            (**(code **)(text_local + 0x18))
                      (text_len,*(undefined8 *)text_local,&gy,glyph_len,local_c4);
            list_00 = font_local;
            fVar3 = g.width;
            fVar2 = g.offset.y;
            fVar1 = g.offset.x;
            x_00 = (float)unicode + g.uv[1].x;
            y = (float)fg_local + g.uv[1].y;
            a = nk_vec2(x_00,y);
            c = nk_vec2(x_00 + fVar1,y + fVar2);
            nk_draw_list_push_rect_uv((nk_draw_list *)list_00,a,c,_gy,g.uv[0],list_local._4_4_);
            next = (int)g.xadvance + next;
            unicode = (nk_rune)(fVar3 + (float)unicode);
            g.xadvance = g.height;
            glyph_len = next_glyph_len;
          }
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_add_text(struct nk_draw_list *list, const struct nk_user_font *font,
    struct nk_rect rect, const char *text, int len, float font_height,
    struct nk_color fg)
{
    float x = 0;
    int text_len = 0;
    nk_rune unicode = 0;
    nk_rune next = 0;
    int glyph_len = 0;
    int next_glyph_len = 0;
    struct nk_user_font_glyph g;

    NK_ASSERT(list);
    if (!list || !len || !text) return;
    if (!NK_INTERSECT(rect.x, rect.y, rect.w, rect.h,
        list->clip_rect.x, list->clip_rect.y, list->clip_rect.w, list->clip_rect.h)) return;

    nk_draw_list_push_image(list, font->texture);
    x = rect.x;
    glyph_len = nk_utf_decode(text, &unicode, len);
    if (!glyph_len) return;

    /* draw every glyph image */
    fg.a = (nk_byte)((float)fg.a * list->config.global_alpha);
    while (text_len < len && glyph_len) {
        float gx, gy, gh, gw;
        float char_width = 0;
        if (unicode == NK_UTF_INVALID) break;

        /* query currently drawn glyph information */
        next_glyph_len = nk_utf_decode(text + text_len + glyph_len, &next, (int)len - text_len);
        font->query(font->userdata, font_height, &g, unicode,
                    (next == NK_UTF_INVALID) ? '\0' : next);

        /* calculate and draw glyph drawing rectangle and image */
        gx = x + g.offset.x;
        gy = rect.y + g.offset.y;
        gw = g.width; gh = g.height;
        char_width = g.xadvance;
        nk_draw_list_push_rect_uv(list, nk_vec2(gx,gy), nk_vec2(gx + gw, gy+ gh),
            g.uv[0], g.uv[1], fg);

        /* offset next glyph */
        text_len += glyph_len;
        x += char_width;
        glyph_len = next_glyph_len;
        unicode = next;
    }
}